

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O2

rotation_t * opengv::math::quaternion2rot(quaternion_t *q)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  rotation_t *R;
  rotation_t *in_RDI;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  dVar1 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar2 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  auVar11._8_8_ = dVar2;
  auVar11._0_8_ = dVar2;
  dVar3 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar3;
  dVar8 = dVar1 * dVar1 - dVar2 * dVar2;
  auVar4 = *(undefined1 (*) [16])
            ((q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.
             array + 2);
  dVar12 = auVar4._0_8_;
  dVar6 = dVar12 * dVar12;
  auVar17._0_8_ = dVar12 * dVar12;
  dVar5 = auVar4._8_8_;
  auVar17._8_8_ = dVar5 * dVar5;
  auVar7 = vshufpd_avx(auVar4,auVar4,1);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar1 * dVar2;
  auVar9 = vfmsub213sd_fma(auVar15,auVar4,auVar18);
  auVar13 = vshufpd_avx(auVar17,auVar17,1);
  dVar16 = auVar13._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[0] =
       ((dVar1 * dVar1 + dVar2 * dVar2) - dVar6) - dVar16;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar1 * dVar12;
  auVar13 = vfmadd231sd_fma(auVar13,auVar11,auVar15);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[6] =
       auVar13._0_8_ + auVar13._0_8_;
  auVar10._0_8_ = dVar12 * dVar1;
  auVar10._8_8_ = dVar5 * dVar1;
  auVar13 = vfmadd213sd_fma(auVar15,auVar4,auVar18);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * dVar3;
  auVar4 = vfmadd231sd_fma(auVar14,auVar11,auVar4);
  auVar7 = vfmsub231pd_fma(auVar10,auVar11,auVar7);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[1] =
       auVar4._0_8_ + auVar4._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[4] =
       (dVar8 + dVar6) - dVar16;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[7] =
       auVar9._0_8_ + auVar9._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[2] =
       auVar7._0_8_ + auVar7._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[3] =
       auVar7._8_8_ + auVar7._8_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[5] =
       auVar13._0_8_ + auVar13._0_8_;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array[8] =
       dVar16 + (dVar8 - dVar6);
  return in_RDI;
}

Assistant:

opengv::rotation_t
opengv::math::quaternion2rot( const quaternion_t & q)
{
  rotation_t R;

  R(0,0) = pow(q[0],2)+pow(q[1],2)-pow(q[2],2)-pow(q[3],2);
  R(0,1) = 2.0*(q[1]*q[2]-q[0]*q[3]);
  R(0,2) = 2.0*(q[1]*q[3]+q[0]*q[2]);
  R(1,0) = 2.0*(q[1]*q[2]+q[0]*q[3]);
  R(1,1) = pow(q[0],2)-pow(q[1],2)+pow(q[2],2)-pow(q[3],2);
  R(1,2) = 2.0*(q[2]*q[3]-q[0]*q[1]);
  R(2,0) = 2.0*(q[1]*q[3]-q[0]*q[2]);
  R(2,1) = 2.0*(q[2]*q[3]+q[0]*q[1]);
  R(2,2) = pow(q[0],2)-pow(q[1],2)-pow(q[2],2)+pow(q[3],2);

  return R;
}